

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O1

Bac_Man_t * Bac_ManReadBacInt(Vec_Str_t *vOut)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Bac_Man_t *pBVar5;
  char *pcVar6;
  size_t sVar7;
  Abc_Nam_t *pAVar8;
  Bac_Ntk_t *pBVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong __size;
  int Pos;
  int Num4;
  int Num3;
  int Num2;
  int Num1;
  int nNtks;
  char Buffer [1000];
  int local_458;
  int local_454;
  uint local_450;
  uint local_44c;
  Bac_Man_t *local_448;
  int local_43c;
  uint local_438;
  int local_434;
  Vec_Str_t *local_430;
  ulong local_428;
  long local_420;
  char local_418 [1000];
  
  memset(local_418,0,1000);
  local_418[0] = '#';
  local_458 = 0;
  while (local_418[0] == '#') {
    iVar3 = BacManReadBacLine(vOut,&local_458,local_418,&stack0xffffffffffffffd0);
    if (iVar3 == 0) {
      return (Bac_Man_t *)0x0;
    }
  }
  iVar3 = BacManReadBacNameAndNums
                    (local_418,(int *)&local_438,(int *)&local_44c,(int *)&local_450,&local_454);
  if (iVar3 == 0) {
    return (Bac_Man_t *)0x0;
  }
  if ((int)local_438 < 1) {
    __assert_fail("nNtks > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                  ,0x9a,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
  }
  pBVar5 = (Bac_Man_t *)calloc(1,0x530);
  pcVar6 = Extra_FileDesignName(local_418);
  pBVar5->pName = pcVar6;
  sVar7 = strlen(local_418);
  pcVar6 = (char *)malloc(sVar7 + 1);
  strcpy(pcVar6,local_418);
  pBVar5->pSpec = pcVar6;
  pAVar8 = Abc_NamStart(1000,0x18);
  pBVar5->pStrs = pAVar8;
  pAVar8 = Abc_NamStart(1000,0x18);
  pBVar5->pMods = pAVar8;
  pBVar5->iRoot = 1;
  pBVar5->nNtks = local_438;
  sVar7 = (ulong)local_438 + 1;
  lVar11 = 0xd0;
  local_428 = (ulong)local_438;
  pBVar9 = (Bac_Ntk_t *)calloc(sVar7,0xd0);
  pBVar5->pNtks = pBVar9;
  do {
    *(Bac_Man_t **)((long)&pBVar9->pDesign + lVar11) = pBVar5;
    lVar11 = lVar11 + 0xd0;
  } while (sVar7 * 0xd0 - lVar11 != 0);
  Bac_ManSetupTypes(pBVar5->pPrimNames,pBVar5->pPrimSymbs);
  if (0 < pBVar5->nNtks) {
    lVar13 = 0xd0;
    lVar11 = 0;
    local_448 = pBVar5;
    local_430 = vOut;
    do {
      pBVar9 = local_448->pNtks;
      iVar3 = BacManReadBacLine(vOut,&local_458,local_418,&stack0xffffffffffffffd0);
      if ((iVar3 == 0) ||
         (iVar4 = BacManReadBacNameAndNums
                            (local_418,&local_43c,(int *)&local_44c,(int *)&local_450,&local_454),
         iVar3 = local_43c, uVar2 = local_44c, uVar1 = local_450, iVar4 == 0)) {
        Bac_ManFree(local_448);
        return (Bac_Man_t *)0x0;
      }
      lVar14 = (long)local_43c;
      local_420 = lVar11;
      if (((lVar14 < 0) || (uVar12 = (ulong)local_44c, (int)local_44c < 0)) ||
         (__size = (ulong)local_450, (int)local_450 < 0)) {
        __assert_fail("Num1 >= 0 && Num2 >= 0 && Num3 >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                      ,0xa9,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
      }
      iVar4 = Abc_NamStrFindOrAdd(local_448->pStrs,local_418,(int *)0x0);
      if (*(long *)((long)&pBVar9->pDesign + lVar13) == 0) {
        __assert_fail("pNew->pDesign != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)&(pBVar9->vInputs).nSize + lVar13) != 0) {
        __assert_fail("Bac_NtkPiNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if (*(int *)((long)&(pBVar9->vOutputs).nSize + lVar13) != 0) {
        __assert_fail("Bac_NtkPoNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      *(int *)((long)&pBVar9->NameId + lVar13) = iVar4;
      *(undefined8 *)((long)&pBVar9->iCopy + lVar13) = 0xffffffffffffffff;
      *(undefined4 *)((long)&pBVar9->iBoxObj + lVar13) = 0xffffffff;
      if (*(int *)((long)&(pBVar9->vInputs).nCap + lVar13) < iVar3) {
        pvVar10 = *(void **)((long)&(pBVar9->vInputs).pArray + lVar13);
        sVar7 = lVar14 << 2;
        if (pvVar10 == (void *)0x0) {
          pvVar10 = malloc(sVar7);
        }
        else {
          pvVar10 = realloc(pvVar10,sVar7);
        }
        *(void **)((long)&(pBVar9->vInputs).pArray + lVar13) = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_008b52ce;
        *(int *)((long)&(pBVar9->vInputs).nCap + lVar13) = iVar3;
      }
      if (*(int *)((long)&(pBVar9->vOutputs).nCap + lVar13) < (int)uVar2) {
        pvVar10 = *(void **)((long)&(pBVar9->vOutputs).pArray + lVar13);
        if (pvVar10 == (void *)0x0) {
          pvVar10 = malloc(uVar12 * 4);
        }
        else {
          pvVar10 = realloc(pvVar10,uVar12 * 4);
        }
        *(void **)((long)&(pBVar9->vOutputs).pArray + lVar13) = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_008b52ce;
        *(uint *)((long)&(pBVar9->vOutputs).nCap + lVar13) = uVar2;
      }
      if (*(int *)((long)&(pBVar9->vType).nCap + lVar13) < (int)uVar1) {
        pvVar10 = *(void **)((long)&(pBVar9->vType).pArray + lVar13);
        if (pvVar10 == (void *)0x0) {
          pvVar10 = malloc(__size);
        }
        else {
          pvVar10 = realloc(pvVar10,__size);
        }
        *(void **)((long)&(pBVar9->vType).pArray + lVar13) = pvVar10;
        *(uint *)((long)&(pBVar9->vType).nCap + lVar13) = uVar1;
      }
      if (*(int *)((long)&(pBVar9->vFanin).nCap + lVar13) < (int)uVar1) {
        pvVar10 = *(void **)((long)&(pBVar9->vFanin).pArray + lVar13);
        if (pvVar10 == (void *)0x0) {
          pvVar10 = malloc(__size * 4);
        }
        else {
          pvVar10 = realloc(pvVar10,__size * 4);
        }
        *(void **)((long)&(pBVar9->vFanin).pArray + lVar13) = pvVar10;
        if (pvVar10 == (void *)0x0) goto LAB_008b52ce;
        *(uint *)((long)&(pBVar9->vFanin).nCap + lVar13) = uVar1;
      }
      lVar11 = *(long *)((long)&pBVar9->pDesign + lVar13);
      pAVar8 = *(Abc_Nam_t **)(lVar11 + 0x18);
      pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(lVar11 + 0x10),iVar4);
      iVar3 = Abc_NamStrFindOrAdd(pAVar8,pcVar6,&local_434);
      lVar11 = *(long *)((long)&pBVar9->pDesign + lVar13);
      if (local_434 == 0) {
        iVar4 = (int)((ulong)((long)pBVar9 + (lVar13 - *(long *)(lVar11 + 0x28))) >> 4) *
                -0x3b13b13b;
        if ((iVar4 < 1) || (*(int *)(lVar11 + 0x24) < iVar4)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (iVar3 != iVar4) {
          __assert_fail("NtkId == Bac_NtkId(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
      }
      else {
        pcVar6 = Abc_NamStr(*(Abc_Nam_t **)(lVar11 + 0x10),iVar4);
        printf("Network with name %s already exists.\n",pcVar6);
      }
      vOut = local_430;
      iVar3 = local_454;
      uVar12 = (long)local_454 * 3;
      iVar4 = (int)uVar12;
      if (*(int *)((long)&(pBVar9->vInfo).nCap + lVar13) < iVar4) {
        pvVar10 = *(void **)((long)&(pBVar9->vInfo).pArray + lVar13);
        sVar7 = (long)local_454 * 0xc;
        if (pvVar10 == (void *)0x0) {
          pvVar10 = malloc(sVar7);
        }
        else {
          pvVar10 = realloc(pvVar10,sVar7);
        }
        *(void **)((long)&(pBVar9->vInfo).pArray + lVar13) = pvVar10;
        if (pvVar10 == (void *)0x0) {
LAB_008b52ce:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)&(pBVar9->vInfo).nCap + lVar13) = iVar4;
      }
      lVar11 = local_420;
      if (0 < iVar3) {
        memset(*(void **)((long)&(pBVar9->vInfo).pArray + lVar13),0xff,(uVar12 & 0xffffffff) << 2);
      }
      *(int *)((long)&(pBVar9->vInfo).nSize + lVar13) = iVar4;
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0xd0;
      pBVar5 = local_448;
    } while (lVar11 < local_448->nNtks);
  }
  iVar3 = pBVar5->nNtks;
  if (0 < iVar3) {
    lVar11 = 0xd0;
    lVar13 = 0;
    do {
      Bac_ManReadBacNtk(vOut,&local_458,(Bac_Ntk_t *)((long)&pBVar5->pNtks->pDesign + lVar11));
      iVar3 = pBVar5->nNtks;
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 0xd0;
    } while (lVar13 < iVar3);
  }
  if (iVar3 != (int)local_428) {
    __assert_fail("Bac_ManNtkNum(p) == nNtks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                  ,0xb1,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
  }
  if (local_458 != vOut->nSize) {
    __assert_fail("Pos == Vec_StrSize(vOut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBac.c"
                  ,0xb2,"Bac_Man_t *Bac_ManReadBacInt(Vec_Str_t *)");
  }
  return pBVar5;
}

Assistant:

Bac_Man_t * Bac_ManReadBacInt( Vec_Str_t * vOut )
{
    Bac_Man_t * p;
    Bac_Ntk_t * pNtk;
    char Buffer[1000] = "#"; 
    int i, NameId, Pos = 0, nNtks, Num1, Num2, Num3, Num4;
    while ( Buffer[0] == '#' )
        if ( !BacManReadBacLine(vOut, &Pos, Buffer, Buffer+1000) )
            return NULL;
    if ( !BacManReadBacNameAndNums(Buffer, &nNtks, &Num2, &Num3, &Num4) )
        return NULL;
    // start manager
    assert( nNtks > 0 );
    p = Bac_ManAlloc( Buffer, nNtks );
    // start networks
    Bac_ManForEachNtk( p, pNtk, i )
    {
        if ( !BacManReadBacLine(vOut, &Pos, Buffer, Buffer+1000) )
        {
            Bac_ManFree( p );
            return NULL;
        }
        if ( !BacManReadBacNameAndNums(Buffer, &Num1, &Num2, &Num3, &Num4) )
        {
            Bac_ManFree( p );
            return NULL;
        }
        assert( Num1 >= 0 && Num2 >= 0 && Num3 >= 0 );
        NameId = Abc_NamStrFindOrAdd( p->pStrs, Buffer, NULL );
        Bac_NtkAlloc( pNtk, NameId, Num1, Num2, Num3 );
        Vec_IntFill( &pNtk->vInfo, 3 * Num4, -1 );
    }
    // read networks
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManReadBacNtk( vOut, &Pos, pNtk );
    assert( Bac_ManNtkNum(p) == nNtks );
    assert( Pos == Vec_StrSize(vOut) );
    return p;
}